

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_DataBlob_impl.hpp
# Opt level: O0

DataBlob * __thiscall hrgls::datablob::DataBlob::operator=(DataBlob *this,DataBlob *copy)

{
  hrgls_Status hVar1;
  DataBlob_private *pDVar2;
  hrgls_DataBlob phVar3;
  DataBlob *copy_local;
  DataBlob *this_local;
  
  if (this->m_private != (DataBlob_private *)0x0) {
    if (this->m_private->blob != (hrgls_DataBlob)0x0) {
      hrgls_DataBlobDestroy(this->m_private->blob);
    }
    if (this->m_private != (DataBlob_private *)0x0) {
      operator_delete(this->m_private);
    }
  }
  pDVar2 = (DataBlob_private *)operator_new(0x10);
  memset(pDVar2,0,0x10);
  DataBlob_private::DataBlob_private(pDVar2);
  this->m_private = pDVar2;
  pDVar2 = this->m_private;
  phVar3 = RawDataBlob(copy);
  hVar1 = hrgls_DataBlobCopy(pDVar2,phVar3);
  this->m_private->status = hVar1;
  return this;
}

Assistant:

DataBlob& DataBlob::operator = (const DataBlob&copy)
    {
      // Get rid of any pre-existing data that we have.
      if (m_private) {
        if (m_private->blob) {
          hrgls_DataBlobDestroy(m_private->blob);
        }
        delete m_private;
      }

      m_private = new DataBlob_private();
      m_private->status = hrgls_DataBlobCopy(&m_private->blob, copy.RawDataBlob());
      return *this;
    }